

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O0

void __thiscall lsim::ModelWire::split_at_new_junction(ModelWire *this,Point *p)

{
  Point this_00;
  bool bVar1;
  pointer this_01;
  ModelWireJunction *pMVar2;
  Point *pPVar3;
  Point local_50;
  Point p_end;
  pointer segment;
  Point local_38;
  unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_> *local_30;
  __normal_iterator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
  local_28;
  __normal_iterator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
  local_20;
  __normal_iterator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
  found;
  Point *p_local;
  ModelWire *this_local;
  
  found._M_current =
       (unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_> *)p;
  bVar1 = point_is_junction(this,p);
  if (!bVar1) {
    local_28._M_current =
         (unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_> *)
         std::
         vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
         ::begin(&this->m_segments);
    local_30 = (unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_> *)
               std::
               vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
               ::end(&this->m_segments);
    local_38 = (Point)((found._M_current)->_M_t).
                      super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
                      .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl;
    local_20 = std::
               find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<lsim::ModelWireSegment,std::default_delete<lsim::ModelWireSegment>>*,std::vector<std::unique_ptr<lsim::ModelWireSegment,std::default_delete<lsim::ModelWireSegment>>,std::allocator<std::unique_ptr<lsim::ModelWireSegment,std::default_delete<lsim::ModelWireSegment>>>>>,lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::__0>
                         (local_28,(__normal_iterator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
                                    )local_30,(anon_class_8_1_54a39810_for__M_pred)local_38);
    segment = (pointer)std::
                       vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                       ::end(&this->m_segments);
    bVar1 = __gnu_cxx::operator==
                      (&local_20,
                       (__normal_iterator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
                        *)&segment);
    if (!bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
                ::operator->(&local_20);
      p_end = (Point)std::
                     unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
                     ::get(this_01);
      pMVar2 = ModelWireSegment::junction((ModelWireSegment *)p_end,1);
      pPVar3 = ModelWireJunction::position(pMVar2);
      local_50 = *pPVar3;
      pMVar2 = ModelWireSegment::junction((ModelWireSegment *)p_end,1);
      ModelWireJunction::remove_segment(pMVar2,(ModelWireSegment *)p_end);
      this_00 = p_end;
      pMVar2 = create_new_junction(this,(Point *)found._M_current,(ModelWireSegment *)p_end);
      ModelWireSegment::set_junction((ModelWireSegment *)this_00,1,pMVar2);
      add_segment(this,(Point *)found._M_current,&local_50);
    }
  }
  return;
}

Assistant:

void ModelWire::split_at_new_junction(const Point &p) {
    // nothing to do if there is already a junction at the specified point
    if (point_is_junction(p)) {
        return;
    }

    // find segment containing the point
    auto found = std::find_if(m_segments.begin(), m_segments.end(), 
                                [p](const auto &s) {return s->point_on_segment(p);});
    if (found == m_segments.end()) {
        return;
    }
    auto segment = found->get();
	
	auto p_end = segment->junction(1)->position();
	segment->junction(1)->remove_segment(segment);
	segment->set_junction(1, create_new_junction(p, segment));
	add_segment(p, p_end);
}